

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::BoundExportData::Deserialize(BoundExportData *this,Deserializer *deserializer)

{
  pointer pBVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_> local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl =
       (tuple<duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>)
       operator_new(0x28);
  *(undefined1 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
          .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl + 8) = 7;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
   super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl =
       &PTR__BoundExportData_027c1208;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
          .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl + 0x20) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
          .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl + 0x10) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
          .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl + 0x18) =
       (_func_int *)0x0;
  pBVar1 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>::
           operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                       *)&local_18);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ExportedTableInfo,true>>
            (deserializer,200,"data",&pBVar1->data);
  (this->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
       .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> BoundExportData::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundExportData>(new BoundExportData());
	deserializer.ReadPropertyWithDefault<vector<ExportedTableInfo>>(200, "data", result->data);
	return std::move(result);
}